

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O1

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,HierarchyInstantiationSyntax *syntax)

{
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  ulong uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  size_t __n;
  value_type_pointer pbVar22;
  ulong uVar23;
  ulong uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  int iVar41;
  size_t sVar42;
  SyntaxNode *node;
  size_t sVar43;
  ulong extraout_RAX;
  ulong uVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  group_type_pointer pgVar48;
  size_t sVar49;
  ulong uVar50;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *arrays_;
  bool bVar51;
  undefined1 auVar52 [16];
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  uchar uVar66;
  uchar uVar67;
  uchar uVar68;
  Token token;
  string_view name;
  value_type *elements;
  locator res;
  string_view local_c8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *local_b8;
  uint64_t local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  size_t local_90;
  ulong local_88;
  group_type_pointer local_80;
  ulong local_78;
  value_type_pointer local_70;
  char *local_68;
  ulong local_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  uchar uStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  uchar uStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  uchar uStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  uchar uStack_49;
  locator local_48;
  
  local_c8 = Token::valueText(&syntax->type);
  if (((local_c8._M_len != 0) && ((syntax->type).kind == Identifier)) &&
     (((this->moduleDeclStack).
       super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
       .len == 0 || (_GLOBAL__N_1::MetadataVisitor::handle(), (extraout_RAX & 1) == 0)))) {
    arrays_ = (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
               *)&(this->meta).globalInstances;
    local_b0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          arrays_,&local_c8);
    uVar47 = local_b0 >>
             ((byte)(this->meta).globalInstances.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                    .arrays.groups_size_index & 0x3f);
    pgVar48 = (this->meta).globalInstances.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
              .arrays.groups_;
    lVar2 = (local_b0 & 0xff) * 4;
    uVar53 = (&UNK_0047fb5c)[lVar2];
    uVar54 = (&UNK_0047fb5d)[lVar2];
    uVar55 = (&UNK_0047fb5e)[lVar2];
    uVar56 = (&UNK_0047fb5f)[lVar2];
    local_70 = (this->meta).globalInstances.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.elements_;
    __n = local_c8._M_len;
    local_68 = local_c8._M_str;
    uVar44 = (ulong)((uint)local_b0 & 7);
    sVar49 = (this->meta).globalInstances.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_size_mask;
    uVar50 = 0;
    uVar57 = uVar53;
    uVar58 = uVar54;
    uVar59 = uVar55;
    uVar60 = uVar56;
    uVar61 = uVar53;
    uVar62 = uVar54;
    uVar63 = uVar55;
    uVar64 = uVar56;
    uVar65 = uVar53;
    uVar66 = uVar54;
    uVar67 = uVar55;
    uVar68 = uVar56;
    local_78 = uVar47;
    do {
      pbVar22 = local_70;
      pgVar3 = pgVar48 + uVar47;
      auVar52[0] = -(pgVar3->m[0].n == uVar53);
      auVar52[1] = -(pgVar3->m[1].n == uVar54);
      auVar52[2] = -(pgVar3->m[2].n == uVar55);
      auVar52[3] = -(pgVar3->m[3].n == uVar56);
      auVar52[4] = -(pgVar3->m[4].n == uVar57);
      auVar52[5] = -(pgVar3->m[5].n == uVar58);
      auVar52[6] = -(pgVar3->m[6].n == uVar59);
      auVar52[7] = -(pgVar3->m[7].n == uVar60);
      auVar52[8] = -(pgVar3->m[8].n == uVar61);
      auVar52[9] = -(pgVar3->m[9].n == uVar62);
      auVar52[10] = -(pgVar3->m[10].n == uVar63);
      auVar52[0xb] = -(pgVar3->m[0xb].n == uVar64);
      auVar52[0xc] = -(pgVar3->m[0xc].n == uVar65);
      auVar52[0xd] = -(pgVar3->m[0xd].n == uVar66);
      auVar52[0xe] = -(pgVar3->m[0xe].n == uVar67);
      auVar52[0xf] = -(pgVar3->m[0xf].n == uVar68);
      uVar45 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe);
      lVar46 = uVar47 * 0x10;
      uVar24 = uVar47;
      uVar25 = uVar53;
      uVar26 = uVar54;
      uVar27 = uVar55;
      uVar28 = uVar56;
      uVar29 = uVar57;
      uVar30 = uVar58;
      uVar31 = uVar59;
      uVar32 = uVar60;
      uVar33 = uVar61;
      uVar34 = uVar62;
      uVar35 = uVar63;
      uVar36 = uVar64;
      uVar37 = uVar65;
      uVar38 = uVar66;
      uVar39 = uVar67;
      uVar40 = uVar68;
      lVar2 = local_a8;
      uVar4 = local_a0;
      uVar5 = local_98;
      uVar23 = local_60;
      uVar6 = local_58;
      uVar7 = uStack_57;
      uVar8 = uStack_56;
      uVar9 = uStack_55;
      uVar10 = uStack_54;
      uVar11 = uStack_53;
      uVar12 = uStack_52;
      uVar13 = uStack_51;
      uVar14 = uStack_50;
      uVar15 = uStack_4f;
      uVar16 = uStack_4e;
      uVar17 = uStack_4d;
      uVar18 = uStack_4c;
      uVar19 = uStack_4b;
      uVar20 = uStack_4a;
      uVar21 = uStack_49;
      while (uStack_49 = uVar40, uStack_4a = uVar39, uStack_4b = uVar38, uStack_4c = uVar37,
            uStack_4d = uVar36, uStack_4e = uVar35, uStack_4f = uVar34, uStack_50 = uVar33,
            uStack_51 = uVar32, uStack_52 = uVar31, uStack_53 = uVar30, uStack_54 = uVar29,
            uStack_55 = uVar28, uStack_56 = uVar27, uStack_57 = uVar26, local_58 = uVar25,
            local_a0 = uVar50, local_98 = uVar24, local_a8 = lVar46, uVar45 != 0) {
        local_60 = (ulong)uVar45;
        iVar41 = 0;
        if (uVar45 != 0) {
          for (; (uVar45 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
          }
        }
        bVar51 = __n == *(size_t *)
                         ((long)&pbVar22[uVar47 * 0xf]._M_len + (ulong)(uint)(iVar41 << 4));
        lVar46 = (long)&pbVar22[uVar47 * 0xf]._M_len + (ulong)(uint)(iVar41 << 4);
        uVar50 = local_60;
        local_b8 = arrays_;
        local_90 = sVar49;
        local_88 = uVar44;
        local_80 = pgVar48;
        if (bVar51 && __n != 0) {
          iVar41 = bcmp(local_68,*(void **)(lVar46 + 8),__n);
          bVar51 = iVar41 == 0;
          uVar50 = local_60;
          uVar53 = local_58;
          uVar54 = uStack_57;
          uVar55 = uStack_56;
          uVar56 = uStack_55;
          uVar57 = uStack_54;
          uVar58 = uStack_53;
          uVar59 = uStack_52;
          uVar60 = uStack_51;
          uVar61 = uStack_50;
          uVar62 = uStack_4f;
          uVar63 = uStack_4e;
          uVar64 = uStack_4d;
          uVar65 = uStack_4c;
          uVar66 = uStack_4b;
          uVar67 = uStack_4a;
          uVar68 = uStack_49;
          uVar23 = local_60;
        }
        local_60 = uVar23;
        arrays_ = local_b8;
        if (bVar51) goto LAB_003d42a0;
        uVar45 = (uint)uVar50 - 1 & (uint)uVar50;
        lVar46 = local_a8;
        uVar44 = local_88;
        uVar24 = local_98;
        pgVar48 = local_80;
        sVar49 = local_90;
        uVar50 = local_a0;
        uVar25 = local_58;
        uVar26 = uStack_57;
        uVar27 = uStack_56;
        uVar28 = uStack_55;
        uVar29 = uStack_54;
        uVar30 = uStack_53;
        uVar31 = uStack_52;
        uVar32 = uStack_51;
        uVar33 = uStack_50;
        uVar34 = uStack_4f;
        uVar35 = uStack_4e;
        uVar36 = uStack_4d;
        uVar37 = uStack_4c;
        uVar38 = uStack_4b;
        uVar39 = uStack_4a;
        uVar40 = uStack_49;
        lVar2 = local_a8;
        uVar4 = local_a0;
        uVar5 = local_98;
        uVar23 = local_60;
        uVar6 = local_58;
        uVar7 = uStack_57;
        uVar8 = uStack_56;
        uVar9 = uStack_55;
        uVar10 = uStack_54;
        uVar11 = uStack_53;
        uVar12 = uStack_52;
        uVar13 = uStack_51;
        uVar14 = uStack_50;
        uVar15 = uStack_4f;
        uVar16 = uStack_4e;
        uVar17 = uStack_4d;
        uVar18 = uStack_4c;
        uVar19 = uStack_4b;
        uVar20 = uStack_4a;
        uVar21 = uStack_49;
      }
      local_60 = uVar23;
      local_58 = uVar6;
      uStack_57 = uVar7;
      uStack_56 = uVar8;
      uStack_55 = uVar9;
      uStack_54 = uVar10;
      uStack_53 = uVar11;
      uStack_52 = uVar12;
      uStack_51 = uVar13;
      uStack_50 = uVar14;
      uStack_4f = uVar15;
      uStack_4e = uVar16;
      uStack_4d = uVar17;
      uStack_4c = uVar18;
      uStack_4b = uVar19;
      uStack_4a = uVar20;
      uStack_49 = uVar21;
      if ((((slot_type *)((long)pgVar48 + 0xf))[local_a8].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar44]) == 0) break;
      uVar50 = local_a0 + 1;
      uVar47 = local_98 + local_a0 + 1 & sVar49;
      local_a8 = lVar2;
      local_a0 = uVar4;
      local_98 = uVar5;
    } while (uVar50 <= sVar49);
    lVar46 = 0;
    local_a8 = lVar2;
    local_a0 = uVar4;
    local_98 = uVar5;
LAB_003d42a0:
    if (lVar46 == 0) {
      if ((this->meta).globalInstances.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.size <
          (this->meta).globalInstances.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                  (&local_48,arrays_,(arrays_type *)arrays_,local_78,local_b0,&local_c8);
        psVar1 = &(this->meta).globalInstances.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                  (&local_48,arrays_,local_b0,&local_c8);
      }
    }
  }
  sVar42 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar42 != 0) {
    uVar45 = 1;
    sVar42 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar42);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar42);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar42 = (size_t)uVar45;
      sVar43 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar45 = uVar45 + 1;
    } while (sVar42 < sVar43);
  }
  return;
}

Assistant:

void handle(const HierarchyInstantiationSyntax& syntax) {
        std::string_view name = syntax.type.valueText();
        if (!name.empty() && syntax.type.kind == TokenKind::Identifier) {
            bool found = false;
            for (auto& set : moduleDeclStack) {
                if (set.find(name) != set.end()) {
                    found = true;
                    break;
                }
            }
            if (!found)
                meta.globalInstances.emplace(name);
        }
        visitDefault(syntax);
    }